

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void hexdump(char *data,char *mask,size_t len)

{
  char cVar1;
  ushort **ppuVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  char *local_60;
  
  iVar3 = (int)len;
  uVar5 = 0;
  do {
    printf("#%07x: ",(ulong)uVar5);
    lVar4 = (long)(int)uVar5;
    local_60 = data + lVar4;
    pcVar6 = mask + lVar4;
    lVar8 = 0;
    iVar9 = 0;
    do {
      lVar7 = 0;
      do {
        cVar1 = '\n';
        if (lVar4 + lVar7 < (long)iVar3) {
          if (mask == (char *)0x0) {
            printf("%02x",(ulong)(byte)local_60[lVar7]);
          }
          else {
            if (pcVar6[lVar7] != '\0') {
              printf("%s","\x1b[30;1m");
            }
            printf("%02x",(ulong)(byte)local_60[lVar7]);
            if ((mask != (char *)0x0) && (pcVar6[lVar7] != '\0')) {
              printf("%s","\x1b[0m");
            }
          }
          iVar9 = iVar9 + 2;
          cVar1 = '\0';
        }
        if ((long)iVar3 <= lVar4 + lVar7) goto LAB_00101694;
        lVar7 = lVar7 + 1;
      } while (lVar7 == 1);
      cVar1 = '\a';
LAB_00101694:
      if (cVar1 != '\a') goto LAB_001016cb;
      putchar(0x20);
      iVar9 = iVar9 + 1;
      lVar8 = lVar8 + 1;
      local_60 = local_60 + 2;
      pcVar6 = pcVar6 + 2;
      lVar4 = lVar4 + 2;
    } while (lVar8 != 8);
    cVar1 = '\x04';
LAB_001016cb:
    if ((cVar1 == '\x04') || (cVar1 == '\n')) {
      if (iVar9 < 0x29) {
        iVar9 = iVar9 + -0x29;
        do {
          putchar(0x20);
          iVar9 = iVar9 + 1;
        } while (iVar9 != 0);
      }
      ppuVar2 = __ctype_b_loc();
      lVar4 = 0;
      do {
        iVar9 = 0x2e;
        if (((*ppuVar2)[(int)data[lVar4 + (int)uVar5]] >> 0xe & 1) != 0) {
          iVar9 = (int)data[lVar4 + (int)uVar5];
        }
        putchar(iVar9);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x10);
      putchar(10);
      uVar5 = uVar5 + 0x10;
      cVar1 = iVar3 <= (int)uVar5;
    }
    if (cVar1 != '\0') {
      return;
    }
  } while( true );
}

Assistant:

void hexdump(const char *data, const char *mask, size_t len)
{
    const char *bold_gray = "\x1b[30;1m";
    const char *reset      = "\x1b[0m";
    int offset = 0;
    while(1)
    {
        //print line
        printf("#%07x: ", offset);

        int char_covered = 0;

        //print hex groups (8)
        for(int i=0; i<8; ++i) {

            //print doublet
            for(int j=0; j<2; ++j) {
                int loffset = offset + 2*i + j;
                if(loffset >= (int)len)
                    goto escape;

                //print hex
                {
                    //start highlight
                    if(mask && mask[loffset]){printf("%s", bold_gray);}

                    //print chars
                    printf("%02x", 0xff&data[loffset]);

                    //end highlight
                    if(mask && mask[loffset]){printf("%s", reset);}
                    char_covered += 2;
                }
            }
            printf(" ");
            char_covered += 1;
        }
escape:

        //print filler if needed
        for(int i=char_covered; i<41; ++i)
            printf(" ");

        //print ascii (16)
        for(int i=0; i<16; ++i) {
            if(isprint(data[offset+i]))
                printf("%c", data[offset+i]);
            else
                printf(".");
        }
        printf("\n");
        offset += 16;
        if(offset >= (int)len)
            return;
    }
}